

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  FSE_DTable FVar7;
  FSE_DTable FVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  undefined1 *puVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong *local_50;
  ulong *local_48;
  
  puVar1 = (undefined1 *)((long)dst + (originalSize - 3));
  local_50 = (ulong *)cSrc;
  if (*(short *)((long)dt + 2) == 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar23 = 0;
      iVar16 = 0;
      puVar15 = (ulong *)0x0;
      local_50 = (ulong *)0x0;
      local_48 = (ulong *)0x0;
    }
    else {
      local_48 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar23 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar23 = uVar23 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar23 = uVar23 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar23 = uVar23 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar23 = uVar23 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar23 = uVar23 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar23 = uVar23 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar17 = 0x1f;
          if (bVar2 != 0) {
            for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          puVar15 = (ulong *)cSrc;
          if (bVar2 == 0) {
            cSrcSize = 0xffffffffffffffec;
            iVar16 = 0;
          }
          else {
            iVar16 = ~uVar17 + (int)cSrcSize * -8 + 0x49;
          }
        }
      }
      else {
        puVar15 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar23 = *puVar15;
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar17 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        iVar16 = ~uVar17 + 9;
        if (bVar2 == 0) {
          iVar16 = 0;
        }
        cSrcSize = cSrcSize | -(ulong)(bVar2 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar6 = (ushort)*dt;
    if (0x1f < uVar6) goto LAB_001086c1;
    uVar17 = iVar16 + (uint)uVar6;
    uVar21 = uVar23 >> (-(char)uVar17 & 0x3fU);
    iVar16 = (int)local_50;
    if (uVar17 < 0x41) {
      if (puVar15 < local_48) {
        if (puVar15 == local_50) goto LAB_00108380;
        uVar20 = (int)puVar15 - iVar16;
        if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3))) {
          uVar20 = uVar17 >> 3;
        }
        uVar17 = uVar17 + uVar20 * -8;
      }
      else {
        uVar20 = uVar17 >> 3;
        uVar17 = uVar17 & 7;
      }
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar20);
      uVar23 = *puVar15;
    }
LAB_00108380:
    uVar17 = uVar17 + uVar6;
    uVar14 = (ulong)((uint)uVar21 & BIT_mask[(uint)uVar6]);
    uVar21 = (ulong)(BIT_mask[(uint)uVar6] & (uint)(uVar23 >> (-(char)uVar17 & 0x3fU)));
    if (uVar17 < 0x41) {
      if (puVar15 < local_48) {
        if (puVar15 == local_50) goto LAB_001083d9;
        uVar20 = (int)puVar15 - iVar16;
        if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3))) {
          uVar20 = uVar17 >> 3;
        }
        uVar17 = uVar17 + uVar20 * -8;
      }
      else {
        uVar20 = uVar17 >> 3;
        uVar17 = uVar17 & 7;
      }
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar20);
      uVar23 = *puVar15;
    }
LAB_001083d9:
    lVar9 = 0;
    do {
      if (uVar17 < 0x41) {
        if (puVar15 < local_48) {
          if (puVar15 == local_50) goto LAB_001083e4;
          bVar25 = local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3));
          uVar20 = (int)puVar15 - iVar16;
          if (bVar25) {
            uVar20 = uVar17 >> 3;
          }
          uVar17 = uVar17 + uVar20 * -8;
        }
        else {
          uVar20 = uVar17 >> 3;
          uVar17 = uVar17 & 7;
          bVar25 = true;
        }
        puVar15 = (ulong *)((long)puVar15 - (ulong)uVar20);
        uVar23 = *puVar15;
      }
      else {
LAB_001083e4:
        bVar25 = false;
      }
      puVar19 = (undefined1 *)((long)dst + lVar9);
      if ((puVar1 <= puVar19) || (!bVar25)) {
        puVar1 = (undefined1 *)((long)dst + (originalSize - 2));
        goto LAB_00108523;
      }
      bVar2 = *(byte *)((long)dt + uVar14 * 4 + 7);
      if (0x1f < (ulong)bVar2) goto LAB_001086c1;
      uVar22 = (ulong)(ushort)dt[uVar14 + 1];
      uVar20 = BIT_mask[bVar2];
      *puVar19 = *(undefined1 *)((long)dt + uVar14 * 4 + 6);
      bVar3 = *(byte *)((long)dt + uVar21 * 4 + 7);
      if (0x1f < (ulong)bVar3) goto LAB_001086c1;
      uVar14 = (ulong)(uVar20 & (uint)(uVar23 >> (-(char)(uVar17 + bVar2) & 0x3fU)));
      uVar24 = (ulong)(ushort)dt[uVar21 + 1];
      uVar20 = BIT_mask[bVar3];
      puVar19[1] = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
      lVar10 = uVar14 * 4;
      bVar4 = *(byte *)((long)dt + uVar22 * 4 + lVar10 + 7);
      if (0x1f < (ulong)bVar4) goto LAB_001086c1;
      iVar18 = uVar17 + bVar2 + (uint)bVar3;
      uVar21 = (ulong)(uVar20 & (uint)(uVar23 >> (-(char)iVar18 & 0x3fU)));
      FVar7 = dt[uVar14 + uVar22 + 1];
      uVar17 = BIT_mask[bVar4];
      puVar19[2] = *(undefined1 *)((long)dt + uVar22 * 4 + lVar10 + 6);
      lVar10 = uVar21 * 4;
      bVar2 = *(byte *)((long)dt + uVar24 * 4 + lVar10 + 7);
      if (0x1f < bVar2) goto LAB_001086c1;
      iVar18 = iVar18 + (uint)bVar4;
      uVar14 = (ulong)(uVar17 & (uint)(uVar23 >> (-(char)iVar18 & 0x3fU))) + (ulong)(ushort)FVar7;
      uVar17 = iVar18 + (uint)bVar2;
      uVar21 = (ulong)((uint)(uVar23 >> (-(char)uVar17 & 0x3fU)) & BIT_mask[bVar2]) +
               (ulong)(ushort)dt[uVar21 + uVar24 + 1];
      puVar19[3] = *(undefined1 *)((long)dt + uVar24 * 4 + lVar10 + 6);
      lVar9 = lVar9 + 4;
    } while( true );
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    local_48 = (ulong *)0x0;
    local_50 = (ulong *)0x0;
    iVar16 = 0;
    uVar23 = 0;
    puVar15 = (ulong *)0x0;
  }
  else {
    local_48 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar23 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar23 = uVar23 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar23 = uVar23 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar23 = uVar23 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar23 = uVar23 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar23 = uVar23 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar23 = uVar23 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar17 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        puVar15 = (ulong *)cSrc;
        if (bVar2 == 0) {
          cSrcSize = 0xffffffffffffffec;
          iVar16 = 0;
        }
        else {
          iVar16 = ~uVar17 + (int)cSrcSize * -8 + 0x49;
        }
      }
    }
    else {
      puVar15 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar23 = *puVar15;
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar17 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      iVar16 = ~uVar17 + 9;
      if (bVar2 == 0) {
        iVar16 = 0;
      }
      cSrcSize = cSrcSize | -(ulong)(bVar2 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  uVar6 = (ushort)*dt;
  if (0x1f < uVar6) goto LAB_001086c1;
  uVar17 = iVar16 + (uint)uVar6;
  uVar21 = uVar23 >> (-(char)uVar17 & 0x3fU);
  iVar16 = (int)local_50;
  if (uVar17 < 0x41) {
    if (puVar15 < local_48) {
      if (puVar15 == local_50) goto LAB_00107fdc;
      uVar20 = (int)puVar15 - iVar16;
      if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3))) {
        uVar20 = uVar17 >> 3;
      }
      uVar17 = uVar17 + uVar20 * -8;
    }
    else {
      uVar20 = uVar17 >> 3;
      uVar17 = uVar17 & 7;
    }
    puVar15 = (ulong *)((long)puVar15 - (ulong)uVar20);
    uVar23 = *puVar15;
  }
LAB_00107fdc:
  uVar17 = uVar17 + uVar6;
  uVar14 = (ulong)((uint)uVar21 & BIT_mask[(uint)uVar6]);
  uVar21 = (ulong)(BIT_mask[(uint)uVar6] & (uint)(uVar23 >> (-(char)uVar17 & 0x3fU)));
  if (uVar17 < 0x41) {
    if (puVar15 < local_48) {
      if (puVar15 == local_50) goto LAB_00108034;
      uVar20 = (int)puVar15 - iVar16;
      if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3))) {
        uVar20 = uVar17 >> 3;
      }
      uVar17 = uVar17 + uVar20 * -8;
    }
    else {
      uVar20 = uVar17 >> 3;
      uVar17 = uVar17 & 7;
    }
    puVar15 = (ulong *)((long)puVar15 - (ulong)uVar20);
    uVar23 = *puVar15;
  }
LAB_00108034:
  lVar9 = 0;
  do {
    if (uVar17 < 0x41) {
      if (puVar15 < local_48) {
        if (puVar15 == local_50) goto LAB_0010803f;
        bVar25 = local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3));
        uVar20 = (int)puVar15 - iVar16;
        if (bVar25) {
          uVar20 = uVar17 >> 3;
        }
        uVar17 = uVar17 + uVar20 * -8;
      }
      else {
        uVar20 = uVar17 >> 3;
        uVar17 = uVar17 & 7;
        bVar25 = true;
      }
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar20);
      uVar23 = *puVar15;
    }
    else {
LAB_0010803f:
      bVar25 = false;
    }
    puVar19 = (undefined1 *)((long)dst + lVar9);
    if ((puVar1 <= puVar19) || (!bVar25)) {
      puVar1 = (undefined1 *)((long)dst + (originalSize - 2));
      break;
    }
    bVar2 = *(byte *)((long)dt + uVar14 * 4 + 7);
    if (bVar2 == 0) goto LAB_001086a2;
    uVar22 = (ulong)(ushort)dt[uVar14 + 1];
    *puVar19 = *(undefined1 *)((long)dt + uVar14 * 4 + 6);
    bVar3 = *(byte *)((long)dt + uVar21 * 4 + 7);
    if (bVar3 == 0) goto LAB_001086a2;
    uVar14 = (uVar23 << ((byte)uVar17 & 0x3f)) >> (-bVar2 & 0x3f);
    uVar24 = (ulong)(ushort)dt[uVar21 + 1];
    puVar19[1] = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    lVar10 = uVar14 * 4;
    bVar4 = *(byte *)((long)dt + uVar22 * 4 + lVar10 + 7);
    if (bVar4 == 0) goto LAB_001086a2;
    uVar21 = (uVar23 << ((byte)(uVar17 + bVar2) & 0x3f)) >> (-bVar3 & 0x3f);
    FVar7 = dt[uVar14 + uVar22 + 1];
    puVar19[2] = *(undefined1 *)((long)dt + uVar22 * 4 + lVar10 + 6);
    lVar10 = uVar21 * 4;
    bVar5 = *(byte *)((long)dt + uVar24 * 4 + lVar10 + 7);
    if (bVar5 == 0) goto LAB_001086a2;
    iVar18 = uVar17 + bVar2 + (uint)bVar3;
    uVar14 = ((uVar23 << ((byte)iVar18 & 0x3f)) >> (-bVar4 & 0x3f)) + (ulong)(ushort)FVar7;
    iVar18 = iVar18 + (uint)bVar4;
    uVar21 = ((uVar23 << ((byte)iVar18 & 0x3f)) >> (-bVar5 & 0x3f)) +
             (ulong)(ushort)dt[uVar21 + uVar24 + 1];
    uVar17 = iVar18 + (uint)bVar5;
    puVar19[3] = *(undefined1 *)((long)dt + uVar24 * 4 + lVar10 + 6);
    lVar9 = lVar9 + 4;
  } while( true );
LAB_0010817b:
  lVar10 = lVar9;
  if (puVar1 < (undefined1 *)((long)dst + lVar10)) {
    return 0xffffffffffffffba;
  }
  bVar2 = *(byte *)((long)dt + uVar14 * 4 + 7);
  if (bVar2 == 0) goto LAB_001086a2;
  FVar7 = dt[uVar14 + 1];
  uVar22 = uVar23 << ((byte)uVar17 & 0x3f);
  uVar17 = uVar17 + bVar2;
  *(undefined1 *)((long)dst + lVar10) = *(undefined1 *)((long)dt + uVar14 * 4 + 6);
  uVar20 = uVar17;
  if (uVar17 < 0x41) {
    if (puVar15 < local_48) {
      if (puVar15 == local_50) goto LAB_00108215;
      uVar11 = (int)puVar15 - iVar16;
      if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3))) {
        uVar11 = uVar17 >> 3;
      }
      uVar20 = uVar17 + uVar11 * -8;
    }
    else {
      uVar11 = uVar17 >> 3;
      uVar20 = uVar17 & 7;
    }
    puVar15 = (ulong *)((long)puVar15 - (ulong)uVar11);
    uVar23 = *puVar15;
  }
LAB_00108215:
  puVar19 = (undefined1 *)((long)dst + lVar10 + 1);
  if (0x40 < uVar17) {
    lVar9 = 2;
    if (*(char *)((long)dt + uVar21 * 4 + 7) == '\0') goto LAB_001086a2;
    goto LAB_001082f3;
  }
  if (puVar1 < puVar19) {
    return 0xffffffffffffffba;
  }
  bVar3 = *(byte *)((long)dt + uVar21 * 4 + 7);
  if (bVar3 == 0) goto LAB_001086a2;
  FVar8 = dt[uVar21 + 1];
  uVar24 = uVar23 << ((byte)uVar20 & 0x3f);
  uVar20 = uVar20 + bVar3;
  *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
  uVar17 = uVar20;
  if (uVar20 < 0x41) {
    if (puVar15 < local_48) {
      if (puVar15 == local_50) goto LAB_001082b2;
      uVar11 = (int)puVar15 - iVar16;
      if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar20 >> 3))) {
        uVar11 = uVar20 >> 3;
      }
      uVar17 = uVar20 + uVar11 * -8;
    }
    else {
      uVar11 = uVar20 >> 3;
      uVar17 = uVar20 & 7;
    }
    puVar15 = (ulong *)((long)puVar15 - (ulong)uVar11);
    uVar23 = *puVar15;
  }
LAB_001082b2:
  uVar14 = (uVar22 >> (-bVar2 & 0x3f)) + (ulong)(ushort)FVar7;
  uVar21 = (uVar24 >> (-bVar3 & 0x3f)) + (ulong)(ushort)FVar8;
  lVar9 = lVar10 + 2;
  if (0x40 < uVar20) {
    if (*(char *)((long)dt + uVar14 * 4 + 7) == '\0') {
LAB_001086a2:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    puVar19 = (undefined1 *)((long)dst + lVar10 + 2);
    lVar9 = 3;
    uVar21 = uVar14;
LAB_001082f3:
    *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    return lVar9 + lVar10;
  }
  goto LAB_0010817b;
LAB_00108523:
  do {
    lVar10 = lVar9;
    if (puVar1 < (undefined1 *)((long)dst + lVar10)) {
      return 0xffffffffffffffba;
    }
    bVar2 = *(byte *)((long)dt + uVar14 * 4 + 7);
    if (0x1f < bVar2) goto LAB_001086c1;
    FVar7 = dt[uVar14 + 1];
    uVar17 = uVar17 + bVar2;
    uVar22 = uVar23 >> (-(char)uVar17 & 0x3fU);
    uVar20 = BIT_mask[bVar2];
    *(undefined1 *)((long)dst + lVar10) = *(undefined1 *)((long)dt + uVar14 * 4 + 6);
    uVar11 = uVar17;
    if (uVar17 < 0x41) {
      if (puVar15 < local_48) {
        if (puVar15 == local_50) goto LAB_001085ba;
        uVar12 = (int)puVar15 - iVar16;
        if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar17 >> 3))) {
          uVar12 = uVar17 >> 3;
        }
        uVar11 = uVar17 + uVar12 * -8;
      }
      else {
        uVar12 = uVar17 >> 3;
        uVar11 = uVar17 & 7;
      }
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar12);
      uVar23 = *puVar15;
    }
LAB_001085ba:
    puVar19 = (undefined1 *)((long)dst + lVar10 + 1);
    if (0x40 < uVar17) {
      lVar9 = 2;
      if (0x1f < *(byte *)((long)dt + uVar21 * 4 + 7)) goto LAB_001086c1;
      goto LAB_00108689;
    }
    if (puVar1 < puVar19) {
      return 0xffffffffffffffba;
    }
    bVar2 = *(byte *)((long)dt + uVar21 * 4 + 7);
    if (0x1f < bVar2) goto LAB_001086c1;
    FVar8 = dt[uVar21 + 1];
    uVar11 = uVar11 + bVar2;
    uVar24 = uVar23 >> (-(char)uVar11 & 0x3fU);
    uVar12 = BIT_mask[bVar2];
    *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    uVar17 = uVar11;
    if (uVar11 < 0x41) {
      if (puVar15 < local_48) {
        if (puVar15 == local_50) goto LAB_00108651;
        uVar13 = (int)puVar15 - iVar16;
        if (local_50 <= (ulong *)((long)puVar15 - (ulong)(uVar11 >> 3))) {
          uVar13 = uVar11 >> 3;
        }
        uVar17 = uVar11 + uVar13 * -8;
      }
      else {
        uVar13 = uVar11 >> 3;
        uVar17 = uVar11 & 7;
      }
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar13);
      uVar23 = *puVar15;
    }
LAB_00108651:
    uVar14 = (ulong)((uint)uVar22 & uVar20) + (ulong)(ushort)FVar7;
    uVar21 = (ulong)((uint)uVar24 & uVar12) + (ulong)(ushort)FVar8;
    lVar9 = lVar10 + 2;
  } while (uVar11 < 0x41);
  if (*(byte *)((long)dt + uVar14 * 4 + 7) < 0x20) {
    puVar19 = (undefined1 *)((long)dst + lVar10 + 2);
    lVar9 = 3;
    uVar21 = uVar14;
LAB_00108689:
    *puVar19 = *(undefined1 *)((long)dt + uVar21 * 4 + 6);
    return lVar9 + lVar10;
  }
LAB_001086c1:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x65d,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}